

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<TPZFlopCounter>::SolveSOR
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,TPZFMatrix<TPZFlopCounter> *F,
          TPZFMatrix<TPZFlopCounter> *result,TPZFMatrix<TPZFlopCounter> *residual,
          TPZFMatrix<TPZFlopCounter> *param_5,REAL overrelax,REAL *tol,int FromCurrent,int direction
          )

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t j;
  long lVar9;
  long lVar10;
  TPZFlopCounter __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x_00;
  undefined1 auVar11 [16];
  double local_a8;
  long lVar5;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  auVar11._8_4_ = 0xffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar11._12_4_ = 0xffffffff;
  TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
  TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] - auVar11._8_8_;
  if (residual == (TPZFMatrix<TPZFlopCounter> *)0x0) {
    local_a8 = *tol + *tol + 1.0;
  }
  else {
    __x = Dot<TPZFlopCounter>(residual,residual);
    if (__x.fVal < 0.0) {
      local_a8 = sqrt(__x.fVal);
    }
    else {
      local_a8 = SQRT(__x.fVal);
    }
    TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar5 = CONCAT44(extraout_var,iVar4);
  lVar10 = 0;
  lVar6 = lVar5 + -1;
  lVar3 = -1;
  if (direction != -1) {
    lVar6 = lVar10;
    lVar3 = lVar5;
  }
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol;
    lVar10 = 0;
    do {
      if (ABS(local_a8) <= ABS(*tol)) break;
      if (lVar1 < 1) {
        __x_00 = 0.0;
      }
      else {
        __x_00 = 0.0;
        lVar7 = 0;
        lVar8 = 0;
        lVar2 = lVar6;
        do {
          for (; lVar2 != lVar3; lVar2 = lVar2 + (ulong)(direction != -1) * 2 + -1) {
            (*(F->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(F,lVar2,lVar8);
            local_a8 = extraout_XMM0_Qa;
            if (0 < lVar5) {
              lVar9 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar2,lVar9);
                if (((result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow <= lVar9) ||
                   ((result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar8)) {
                  TPZFMatrix<TPZFlopCounter>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_a8 = local_a8 -
                           extraout_XMM0_Qa_00 *
                           *(REAL *)((long)&result->fElem[lVar9].fVal +
                                    (result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.
                                    fRow * lVar7);
                TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
                TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
                lVar9 = lVar9 + 1;
              } while (lVar5 != lVar9);
            }
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar2)
            ;
            TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
            if (((lVar2 < 0) ||
                ((result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow <= lVar2)) ||
               ((result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<TPZFlopCounter>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow * lVar8;
            result->fElem[lVar9 + lVar2].fVal =
                 (local_a8 * overrelax) / extraout_XMM0_Qa_01 + result->fElem[lVar9 + lVar2].fVal;
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            __x_00 = __x_00 + local_a8 * local_a8;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 8;
          lVar2 = lVar6;
        } while (lVar8 != lVar1);
      }
      if (__x_00 < 0.0) {
        local_a8 = sqrt(__x_00);
      }
      else {
        local_a8 = SQRT(__x_00);
      }
      TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *numiterations);
  }
  if (residual != (TPZFMatrix<TPZFlopCounter> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,residual);
  }
  *numiterations = lVar10;
  *tol = ABS(local_a8);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}